

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::NamedStructurePatternMemberSyntax::setChild
          (NamedStructurePatternMemberSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  Token TVar2;
  
  if (index == 2) {
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      pSVar1 = (SyntaxNode *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node(&child);
    }
    (this->pattern).ptr = (PatternSyntax *)pSVar1;
  }
  else if (index == 1) {
    TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->colon).kind = TVar2.kind;
    (this->colon).field_0x2 = TVar2._2_1_;
    (this->colon).numFlags = (NumericTokenFlags)TVar2.numFlags.raw;
    (this->colon).rawLen = TVar2.rawLen;
    (this->colon).info = TVar2.info;
  }
  else {
    TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->name).kind = TVar2.kind;
    (this->name).field_0x2 = TVar2._2_1_;
    (this->name).numFlags = (NumericTokenFlags)TVar2.numFlags.raw;
    (this->name).rawLen = TVar2.rawLen;
    (this->name).info = TVar2.info;
  }
  return;
}

Assistant:

void NamedStructurePatternMemberSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: name = child.token(); return;
        case 1: colon = child.token(); return;
        case 2: pattern = child.node() ? &child.node()->as<PatternSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}